

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_DataValue *
UA_Server_read(UA_DataValue *__return_storage_ptr__,UA_Server *server,UA_ReadValueId *item,
              UA_TimestampsToReturn timestamps)

{
  __return_storage_ptr__->serverTimestamp = 0;
  *(undefined8 *)&__return_storage_ptr__->serverPicoseconds = 0;
  __return_storage_ptr__->sourceTimestamp = 0;
  *(undefined8 *)&__return_storage_ptr__->sourcePicoseconds = 0;
  (__return_storage_ptr__->value).arrayDimensions = (UA_UInt32 *)0x0;
  *(undefined8 *)&__return_storage_ptr__->status = 0;
  (__return_storage_ptr__->value).data = (void *)0x0;
  (__return_storage_ptr__->value).arrayDimensionsSize = 0;
  *(undefined8 *)&(__return_storage_ptr__->value).storageType = 0;
  (__return_storage_ptr__->value).arrayLength = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->value).type = (UA_DataType *)0x0;
  Service_Read_single(server,(UA_Session *)server,timestamps,item,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UA_DataValue
UA_Server_read(UA_Server *server, const UA_ReadValueId *item,
               UA_TimestampsToReturn timestamps) {
    UA_DataValue dv;
    UA_DataValue_init(&dv);
    UA_RCU_LOCK();
    Service_Read_single(server, &adminSession, timestamps, item, &dv);
    UA_RCU_UNLOCK();
    return dv;
}